

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O3

void __thiscall
sc_core::sc_signal_t<bool,_(sc_core::sc_writer_policy)1>::dump
          (sc_signal_t<bool,_(sc_core::sc_writer_policy)1> *this,ostream *os)

{
  char *__s;
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"     name = ",0xc);
  __s = (this->super_sc_signal_channel).super_sc_prim_channel.super_sc_object.m_name._M_dataplus.
        _M_p;
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
  }
  bVar1 = SUB81(os,0);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + bVar1);
  std::ostream::put(bVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"    value = ",0xc);
  poVar3 = std::ostream::_M_insert<bool>(bVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"new value = ",0xc);
  poVar3 = std::ostream::_M_insert<bool>(bVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void
sc_signal_t<T,POL>::dump( ::std::ostream& os ) const
{
    os << "     name = " << name() << ::std::endl;
    os << "    value = " << m_cur_val << ::std::endl;
    os << "new value = " << m_new_val << ::std::endl;
}